

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_CenterAlign_Test::TestBody(FormatterTest_CenterAlign_Test *this)

{
  int *in_RCX;
  char *pcVar1;
  char *pcVar2;
  longdouble local_48;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_48 = (longdouble)CONCAT64(local_48._4_6_,0x2a);
  fmt::v5::format<char[7],int>(&local_28,(v5 *)"{0:^5}",(char (*) [7])&local_48,in_RCX);
  pcVar1 = " 42  ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" 42  \"","format(\"{0:^5}\", 42)",(char (*) [6])" 42  ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x391;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x391,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT64(local_48._4_6_,0x22);
  fmt::v5::format<char[8],int>(&local_28,(v5 *)"{0:^5o}",(char (*) [8])&local_48,(int *)pcVar1);
  pcVar1 = " 42  ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" 42  \"","format(\"{0:^5o}\", 042)",(char (*) [6])" 42  ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x392;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x392,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT64(local_48._4_6_,0x42);
  fmt::v5::format<char[8],int>(&local_28,(v5 *)"{0:^5x}",(char (*) [8])&local_48,(int *)pcVar1);
  pcVar1 = " 42  ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" 42  \"","format(\"{0:^5x}\", 0x42)",(char (*) [6])" 42  ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x393;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x393,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT64(local_48._4_6_,0xffffffd6);
  fmt::v5::format<char[7],int>(&local_28,(v5 *)"{0:^5}",(char (*) [7])&local_48,(int *)pcVar1);
  pcVar1 = " -42 ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" -42 \"","format(\"{0:^5}\", -42)",(char (*) [6])" -42 ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x394;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x394,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT64(local_48._4_6_,0x2a);
  fmt::v5::format<char[7],unsigned_int>
            (&local_28,(v5 *)"{0:^5}",(char (*) [7])&local_48,(uint *)pcVar1);
  pcVar1 = " 42  ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" 42  \"","format(\"{0:^5}\", 42u)",(char (*) [6])" 42  ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x395;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x395,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT28(local_48._8_2_,0xffffffffffffffd6);
  fmt::v5::format<char[7],long>(&local_28,(v5 *)"{0:^5}",(char (*) [7])&local_48,(long *)pcVar1);
  pcVar1 = " -42 ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" -42 \"","format(\"{0:^5}\", -42l)",(char (*) [6])" -42 ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x396;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x396,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT28(local_48._8_2_,0x2a);
  fmt::v5::format<char[7],unsigned_long>
            (&local_28,(v5 *)"{0:^5}",(char (*) [7])&local_48,(unsigned_long *)pcVar1);
  pcVar1 = " 42  ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" 42  \"","format(\"{0:^5}\", 42ul)",(char (*) [6])" 42  ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x397;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x397,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT28(local_48._8_2_,0xffffffffffffffd6);
  fmt::v5::format<char[7],long_long>
            (&local_28,(v5 *)"{0:^5}",(char (*) [7])&local_48,(longlong *)pcVar1);
  pcVar1 = " -42 ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" -42 \"","format(\"{0:^5}\", -42ll)",(char (*) [6])" -42 ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x398;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x398,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT28(local_48._8_2_,0x2a);
  fmt::v5::format<char[7],unsigned_long_long>
            (&local_28,(v5 *)"{0:^5}",(char (*) [7])&local_48,(unsigned_long_long *)pcVar1);
  pcVar1 = " 42  ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" 42  \"","format(\"{0:^5}\", 42ull)",(char (*) [6])" 42  ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x399;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x399,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT28(local_48._8_2_,0xc045000000000000);
  fmt::v5::format<char[7],double>(&local_28,(v5 *)"{0:^6}",(char (*) [7])&local_48,(double *)pcVar1)
  ;
  pcVar1 = " -42  ";
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" -42  \"","format(\"{0:^6}\", -42.0)",(char (*) [7])" -42  ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x39a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)-42.0;
  fmt::v5::format<char[7],long_double>
            (&local_28,(v5 *)"{0:^5}",(char (*) [7])&local_48,(longdouble *)pcVar1);
  pcVar1 = " -42 ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" -42 \"","format(\"{0:^5}\", -42.0l)",(char (*) [6])" -42 ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x39b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT91(local_48._1_9_,99);
  fmt::v5::format<char[7],char>(&local_28,(v5 *)"{0:^5}",(char (*) [7])&local_48,pcVar1);
  pcVar1 = "  c  ";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"  c  \"","format(\"{0:^5}\", \'c\')",(char (*) [6])"  c  ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x39c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<char[7],char[4]>
            (&local_28,(v5 *)"{0:^6}",(char (*) [7])0x1e6e09,(char (*) [4])pcVar1);
  pcVar1 = " abc  ";
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" abc  \"","format(\"{0:^6}\", \"abc\")",(char (*) [7])" abc  "
             ,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x39d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48 = (longdouble)CONCAT28(local_48._8_2_,0xface);
  fmt::v5::format<char[7],void*>(&local_28,(v5 *)"{0:^8}",(char (*) [7])&local_48,(void **)pcVar1);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\" 0xface \"",
             "format(\"{0:^8}\", reinterpret_cast<void*>(0xface))",(char (*) [9])" 0xface ",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatterTest, CenterAlign) {
  EXPECT_EQ(" 42  ", format("{0:^5}", 42));
  EXPECT_EQ(" 42  ", format("{0:^5o}", 042));
  EXPECT_EQ(" 42  ", format("{0:^5x}", 0x42));
  EXPECT_EQ(" -42 ", format("{0:^5}", -42));
  EXPECT_EQ(" 42  ", format("{0:^5}", 42u));
  EXPECT_EQ(" -42 ", format("{0:^5}", -42l));
  EXPECT_EQ(" 42  ", format("{0:^5}", 42ul));
  EXPECT_EQ(" -42 ", format("{0:^5}", -42ll));
  EXPECT_EQ(" 42  ", format("{0:^5}", 42ull));
  EXPECT_EQ(" -42  ", format("{0:^6}", -42.0));
  EXPECT_EQ(" -42 ", format("{0:^5}", -42.0l));
  EXPECT_EQ("  c  ", format("{0:^5}", 'c'));
  EXPECT_EQ(" abc  ", format("{0:^6}", "abc"));
  EXPECT_EQ(" 0xface ", format("{0:^8}", reinterpret_cast<void*>(0xface)));
}